

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O3

void Diligent::CopyRTShaderGroupNames
               (unordered_map<Diligent::HashMapStringKey,_unsigned_int,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>_>
                *NameToGroupIndex,RayTracingPipelineStateCreateInfo *CreateInfo,
               FixedLinearAllocator *MemPool)

{
  uint uVar1;
  Char *pCVar2;
  char (*in_RCX) [118];
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_false,_false>,_bool>
  pVar8;
  string msg;
  int local_6c;
  string local_68;
  ulong local_48;
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,unsigned_int>,std::allocator<std::pair<Diligent::HashMapStringKey_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_40;
  FixedLinearAllocator *local_38;
  
  uVar6 = 0;
  uVar5 = 0;
  local_40 = (_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,unsigned_int>,std::allocator<std::pair<Diligent::HashMapStringKey_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)NameToGroupIndex;
  local_38 = MemPool;
  if (CreateInfo->GeneralShaderCount != 0) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      pCVar2 = FixedLinearAllocator::CopyString
                         (local_38,*(char **)((long)&CreateInfo->pGeneralShaders->Name + lVar7),0);
      HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_68,pCVar2,false);
      local_6c = (int)uVar5;
      pVar8 = std::
              _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,unsigned_int>,std::allocator<std::pair<Diligent::HashMapStringKey_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<Diligent::HashMapStringKey,unsigned_int>(local_40,&local_68,&local_6c);
      if ((local_68._M_dataplus._M_p != (Char *)0x0) && ((long)local_68._M_string_length < 0)) {
        operator_delete__(local_68._M_dataplus._M_p);
      }
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        FormatString<char[100]>
                  (&local_68,
                   (char (*) [100])
                   "All group names must be unique. ValidateRayTracingPipelineCreateInfo() should\'ve caught this error."
                  );
        in_RCX = (char (*) [118])0x32e;
        DebugAssertionFailed
                  (local_68._M_dataplus._M_p,"CopyRTShaderGroupNames",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x32e);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      uVar5 = uVar5 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar5 < CreateInfo->GeneralShaderCount);
  }
  if (CreateInfo->TriangleHitShaderCount != 0) {
    local_48 = uVar5 & 0xffffffff;
    lVar7 = 0;
    uVar3 = 0;
    do {
      pCVar2 = FixedLinearAllocator::CopyString
                         (local_38,*(char **)((long)&CreateInfo->pTriangleHitShaders->Name + lVar7),
                          0);
      HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_68,pCVar2,false);
      local_6c = (int)local_48 + (int)uVar3;
      pVar8 = std::
              _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,unsigned_int>,std::allocator<std::pair<Diligent::HashMapStringKey_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<Diligent::HashMapStringKey,unsigned_int>(local_40,&local_68,&local_6c);
      if ((local_68._M_dataplus._M_p != (Char *)0x0) && ((long)local_68._M_string_length < 0)) {
        operator_delete__(local_68._M_dataplus._M_p);
      }
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        FormatString<char[100]>
                  (&local_68,
                   (char (*) [100])
                   "All group names must be unique. ValidateRayTracingPipelineCreateInfo() should\'ve caught this error."
                  );
        in_RCX = (char (*) [118])0x334;
        DebugAssertionFailed
                  (local_68._M_dataplus._M_p,"CopyRTShaderGroupNames",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x334);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      uVar3 = uVar3 + 1;
      uVar6 = CreateInfo->TriangleHitShaderCount;
      lVar7 = lVar7 + 0x18;
    } while (uVar3 < uVar6);
    uVar5 = (ulong)(uint)((int)uVar5 + (int)uVar3);
  }
  iVar4 = (int)uVar5;
  if (CreateInfo->ProceduralHitShaderCount == 0) {
    uVar1 = 0;
  }
  else {
    local_48 = uVar5 & 0xffffffff;
    lVar7 = 0;
    uVar5 = 0;
    do {
      pCVar2 = FixedLinearAllocator::CopyString
                         (local_38,*(char **)((long)&CreateInfo->pProceduralHitShaders->Name + lVar7
                                             ),0);
      HashMapStringKey::HashMapStringKey((HashMapStringKey *)&local_68,pCVar2,false);
      local_6c = (int)local_48 + (int)uVar5;
      pVar8 = std::
              _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,unsigned_int>,std::allocator<std::pair<Diligent::HashMapStringKey_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<Diligent::HashMapStringKey,unsigned_int>(local_40,&local_68,&local_6c);
      if ((local_68._M_dataplus._M_p != (Char *)0x0) && ((long)local_68._M_string_length < 0)) {
        operator_delete__(local_68._M_dataplus._M_p);
      }
      if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        FormatString<char[100]>
                  (&local_68,
                   (char (*) [100])
                   "All group names must be unique. ValidateRayTracingPipelineCreateInfo() should\'ve caught this error."
                  );
        in_RCX = (char (*) [118])0x33a;
        DebugAssertionFailed
                  (local_68._M_dataplus._M_p,"CopyRTShaderGroupNames",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x33a);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      uVar5 = uVar5 + 1;
      uVar1 = CreateInfo->ProceduralHitShaderCount;
      lVar7 = lVar7 + 0x20;
    } while (uVar5 < uVar1);
    uVar6 = CreateInfo->TriangleHitShaderCount;
    iVar4 = iVar4 + (int)uVar5;
  }
  if (uVar1 + CreateInfo->GeneralShaderCount + uVar6 != iVar4) {
    FormatString<char[26],char[118]>
              (&local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "CreateInfo.GeneralShaderCount + CreateInfo.TriangleHitShaderCount + CreateInfo.ProceduralHitShaderCount == GroupIndex"
               ,in_RCX);
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"CopyRTShaderGroupNames",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x33d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void CopyRTShaderGroupNames(std::unordered_map<HashMapStringKey, Uint32>& NameToGroupIndex,
                            const RayTracingPipelineStateCreateInfo&      CreateInfo,
                            FixedLinearAllocator&                         MemPool) noexcept
{
    Uint32 GroupIndex = 0;

    for (Uint32 i = 0; i < CreateInfo.GeneralShaderCount; ++i)
    {
        const char* Name      = CreateInfo.pGeneralShaders[i].Name;
        const bool  IsNewName = NameToGroupIndex.emplace(HashMapStringKey{MemPool.CopyString(Name)}, GroupIndex++).second;
        VERIFY(IsNewName, "All group names must be unique. ValidateRayTracingPipelineCreateInfo() should've caught this error.");
    }
    for (Uint32 i = 0; i < CreateInfo.TriangleHitShaderCount; ++i)
    {
        const char* Name      = CreateInfo.pTriangleHitShaders[i].Name;
        const bool  IsNewName = NameToGroupIndex.emplace(HashMapStringKey{MemPool.CopyString(Name)}, GroupIndex++).second;
        VERIFY(IsNewName, "All group names must be unique. ValidateRayTracingPipelineCreateInfo() should've caught this error.");
    }
    for (Uint32 i = 0; i < CreateInfo.ProceduralHitShaderCount; ++i)
    {
        const char* Name      = CreateInfo.pProceduralHitShaders[i].Name;
        const bool  IsNewName = NameToGroupIndex.emplace(HashMapStringKey{MemPool.CopyString(Name)}, GroupIndex++).second;
        VERIFY(IsNewName, "All group names must be unique. ValidateRayTracingPipelineCreateInfo() should've caught this error.");
    }

    VERIFY_EXPR(CreateInfo.GeneralShaderCount + CreateInfo.TriangleHitShaderCount + CreateInfo.ProceduralHitShaderCount == GroupIndex);
}